

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_len(HSQUIRRELVM v)

{
  SQInteger x;
  SQObjectPtr *in_RDI;
  SQInteger in_stack_ffffffffffffffd0;
  SQVM *this;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  
  x = sq_getsize(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  this = (SQVM *)&stack0xffffffffffffffe8;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,x);
  SQVM::Push(this,in_RDI);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return 1;
}

Assistant:

static SQInteger default_delegate_len(HSQUIRRELVM v)
{
    v->Push(SQInteger(sq_getsize(v,1)));
    return 1;
}